

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void repeatstat(LexState *ls,int line)

{
  FuncState *fs_00;
  byte bVar1;
  int target;
  int list;
  undefined1 local_58 [4];
  int exit;
  BlockCnt bl2;
  BlockCnt bl1;
  int repeat_init;
  FuncState *fs;
  int condexit;
  int line_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  target = luaK_getlabel(fs_00);
  enterblock(fs_00,(BlockCnt *)&bl2.nactvar,'\x01');
  enterblock(fs_00,(BlockCnt *)local_58,'\0');
  luaX_next(ls);
  statlist(ls);
  check_match(ls,0x114,0x110,line);
  fs._0_4_ = cond(ls);
  leaveblock(fs_00);
  if (bl2.firstlabel._1_1_ != '\0') {
    list = luaK_jump(fs_00);
    luaK_patchtohere(fs_00,(int)fs);
    bVar1 = reglevel(fs_00,(uint)(byte)bl2.firstlabel);
    luaK_codeABCk(fs_00,OP_CLOSE,(uint)bVar1,0,0,0);
    fs._0_4_ = luaK_jump(fs_00);
    luaK_patchtohere(fs_00,list);
  }
  luaK_patchlist(fs_00,(int)fs,target);
  leaveblock(fs_00);
  return;
}

Assistant:

static void repeatstat (LexState *ls, int line) {
  /* repeatstat -> REPEAT block UNTIL cond */
  int condexit;
  FuncState *fs = ls->fs;
  int repeat_init = luaK_getlabel(fs);
  BlockCnt bl1, bl2;
  enterblock(fs, &bl1, 1);  /* loop block */
  enterblock(fs, &bl2, 0);  /* scope block */
  luaX_next(ls);  /* skip REPEAT */
  statlist(ls);
  check_match(ls, TK_UNTIL, TK_REPEAT, line);
  condexit = cond(ls);  /* read condition (inside scope block) */
  leaveblock(fs);  /* finish scope */
  if (bl2.upval) {  /* upvalues? */
    int exit = luaK_jump(fs);  /* normal exit must jump over fix */
    luaK_patchtohere(fs, condexit);  /* repetition must close upvalues */
    luaK_codeABC(fs, OP_CLOSE, reglevel(fs, bl2.nactvar), 0, 0);
    condexit = luaK_jump(fs);  /* repeat after closing upvalues */
    luaK_patchtohere(fs, exit);  /* normal exit comes to here */
  }
  luaK_patchlist(fs, condexit, repeat_init);  /* close the loop */
  leaveblock(fs);  /* finish loop */
}